

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.h
# Opt level: O0

libnbt * __thiscall libnbt::readString_abi_cxx11_(libnbt *this,istream *in,int16_t length)

{
  undefined2 local_1a;
  char ch;
  int16_t length_local;
  istream *in_local;
  string *temp;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::clear();
  local_1a = length;
  while (local_1a != 0) {
    std::istream::get((char *)in);
    std::__cxx11::string::push_back((char)this);
    local_1a = local_1a + -1;
  }
  return this;
}

Assistant:

static std::string readString(std::istream &in, int16_t length) {
        std::string temp;
        temp.clear();
        char ch;
        while (length--) {
            in.get(ch);
            temp.push_back(ch);
        }
        return temp;
    }